

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool CheckDataDirOption(ArgsManager *args)

{
  string arg;
  bool bVar1;
  long in_FS_OFFSET;
  path datadir;
  undefined1 in_stack_ffffffffffffff68 [16];
  _Alloc_hider _Var2;
  size_type sVar3;
  undefined1 local_60 [40];
  long local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"-datadir",(allocator<char> *)&stack0xffffffffffffff77);
  _Var2._M_p = (pointer)0x0;
  sVar3 = 0;
  std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff78);
  arg.field_2._M_allocated_capacity = (size_type)_Var2._M_p;
  arg._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff68._0_8_;
  arg._M_string_length = in_stack_ffffffffffffff68._8_8_;
  arg.field_2._8_8_ = sVar3;
  ArgsManager::GetPathArg((path *)(local_60 + 0x20),args,arg,(path *)local_60);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)local_60);
  if (local_38 == 0) {
    bVar1 = true;
  }
  else {
    fs::absolute((path *)&stack0xffffffffffffff78,(path *)(local_60 + 0x20));
    bVar1 = std::filesystem::is_directory((path *)&stack0xffffffffffffff78);
    std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff78);
  }
  std::filesystem::__cxx11::path::~path((path *)(local_60 + 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckDataDirOption(const ArgsManager& args)
{
    const fs::path datadir{args.GetPathArg("-datadir")};
    return datadir.empty() || fs::is_directory(fs::absolute(datadir));
}